

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O3

void __thiscall chrono::ChFunctionRotation_SQUAD::SetClosed(ChFunctionRotation_SQUAD *this,bool mc)

{
  ChVectorDynamic<> *this_00;
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  long lVar4;
  vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> *this_01;
  size_type n;
  size_type sVar5;
  
  if (this->closed != mc) {
    pCVar1 = (this->rotations).
             super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar2 = (this->rotations).
             super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_01 = &this->rotations;
    this_00 = &this->knots;
    lVar4 = (long)pCVar1 - (long)pCVar2;
    if (mc) {
      sVar5 = (lVar4 >> 5) + 1;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(this_01,sVar5);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,sVar5);
      lVar3 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      if (lVar3 < 0) {
LAB_0089d6e3:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (lVar3 != 0) {
        memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar3 << 3);
      }
      geometry::ChBasisToolsBspline::ComputeKnotUniform(this_00,1,0.0,1.0);
      if (pCVar1 != pCVar2) {
        pCVar1 = (this_01->
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(double *)((long)pCVar1 + lVar4) = pCVar1->m_data[0];
        *(double *)((long)pCVar1 + lVar4 + 8) = pCVar1->m_data[1];
        *(double *)((long)pCVar1 + lVar4 + 0x10) = pCVar1->m_data[2];
        *(double *)((long)pCVar1 + lVar4 + 0x18) = pCVar1->m_data[3];
      }
    }
    else {
      sVar5 = (lVar4 >> 5) - 1;
      std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
      resize(this_01,sVar5);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,sVar5);
      lVar4 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      if (lVar4 < 0) goto LAB_0089d6e3;
      if (lVar4 != 0) {
        memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar4 << 3);
      }
      geometry::ChBasisToolsBspline::ComputeKnotUniform(this_00,1,0.0,1.0);
    }
    this->closed = mc;
  }
  return;
}

Assistant:

void ChFunctionRotation_SQUAD::SetClosed(bool mc) {
	if (this->closed == mc)
		return;

	// switch open->closed
	if (mc == true) {
		// add p control points to be wrapped: resize knots and control points
		auto n = this->rotations.size();
		n += 1; 
		this->rotations.resize(n);
		this->knots.setZero(n);
		
		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, 1);
		
		// wrap last control point
		this->rotations[n - 1] = this->rotations[0];
	}
	
	// switch closed->open
	if (mc == false) {
		// remove p control points that was wrapped: resize knots and control points
		auto n = this->rotations.size();
		n -= 1; 
		this->rotations.resize(n);
		this->knots.setZero(n);

		// recompute knot vector spacing
        geometry::ChBasisToolsBspline::ComputeKnotUniform(this->knots, 1);
	}

	this->closed = mc;
}